

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O3

void bcwrite_ktabk(BCWriteCtx *ctx,cTValue *o,int narrow)

{
  uint uVar1;
  double dVar2;
  ulong uVar3;
  char *pcVar4;
  uint32_t uVar5;
  byte *pbVar6;
  
  pbVar6 = (byte *)(ctx->sb).w;
  if ((uint)(*(int *)&(ctx->sb).e - (int)pbVar6) < 0xb) {
    pbVar6 = (byte *)lj_buf_more2(&ctx->sb,0xb);
  }
  dVar2 = o->n;
  uVar3 = (long)dVar2 >> 0x2f;
  if (uVar3 == 0xfffffffffffffffb) {
    uVar1 = *(uint *)(((ulong)dVar2 & 0x7fffffffffff) + 0x14);
    uVar5 = uVar1 + 5;
    pcVar4 = (ctx->sb).w;
    if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar4) < uVar5) {
      pcVar4 = lj_buf_more2(&ctx->sb,uVar5);
    }
    pcVar4 = lj_strfmt_wuleb128(pcVar4,uVar5);
    memcpy(pcVar4,(void *)(((ulong)dVar2 & 0x7fffffffffff) + 0x18),(ulong)uVar1);
    pbVar6 = (byte *)(pcVar4 + uVar1);
    goto LAB_00124a51;
  }
  if (0xfffffffffffffff1 < uVar3) {
    *pbVar6 = ~(byte)uVar3;
    pbVar6 = pbVar6 + 1;
    goto LAB_00124a51;
  }
  if (narrow == 0) {
LAB_00124a16:
    *pbVar6 = 4;
    pbVar6 = (byte *)lj_strfmt_wuleb128((char *)(pbVar6 + 1),(o->u32).lo);
    uVar5 = (o->field_4).it;
  }
  else {
    if ((dVar2 != (double)(int)dVar2) || (NAN(dVar2) || NAN((double)(int)dVar2))) goto LAB_00124a16;
    uVar5 = (uint32_t)dVar2;
    *pbVar6 = 3;
    pbVar6 = pbVar6 + 1;
  }
  pbVar6 = (byte *)lj_strfmt_wuleb128((char *)pbVar6,uVar5);
LAB_00124a51:
  (ctx->sb).w = (char *)pbVar6;
  return;
}

Assistant:

static void bcwrite_ktabk(BCWriteCtx *ctx, cTValue *o, int narrow)
{
  char *p = lj_buf_more(&ctx->sb, 1+10);
  if (tvisstr(o)) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    p = lj_buf_more(&ctx->sb, 5+len);
    p = lj_strfmt_wuleb128(p, BCDUMP_KTAB_STR+len);
    p = lj_buf_wmem(p, strdata(str), len);
  } else if (tvisint(o)) {
    *p++ = BCDUMP_KTAB_INT;
    p = lj_strfmt_wuleb128(p, intV(o));
  } else if (tvisnum(o)) {
    if (!LJ_DUALNUM && narrow) {  /* Narrow number constants to integers. */
      lua_Number num = numV(o);
      int32_t k = lj_num2int(num);
      if (num == (lua_Number)k) {  /* -0 is never a constant. */
	*p++ = BCDUMP_KTAB_INT;
	p = lj_strfmt_wuleb128(p, k);
	ctx->sb.w = p;
	return;
      }
    }
    *p++ = BCDUMP_KTAB_NUM;
    p = lj_strfmt_wuleb128(p, o->u32.lo);
    p = lj_strfmt_wuleb128(p, o->u32.hi);
  } else {
    lj_assertBCW(tvispri(o), "unhandled type %d", itype(o));
    *p++ = BCDUMP_KTAB_NIL+~itype(o);
  }
  ctx->sb.w = p;
}